

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O3

void do_cmd_study_book(command *cmd)

{
  class_spell *pcVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  class_book *pcVar5;
  long lVar6;
  long lVar7;
  uint32_t m;
  uint32_t uVar8;
  object *book_obj;
  wchar_t local_3c;
  object *local_38;
  
  _Var2 = player_can_study(player,true);
  if ((_Var2) &&
     (wVar3 = cmd_get_item((command_conflict *)cmd,"item",&local_38,"Study which book? ",
                           "You cannot learn any new spells from the books you have.",obj_can_study,
                           L'\x06'), wVar3 == L'\0')) {
    pcVar5 = player_object_to_book(player,local_38);
    track_object(player->upkeep,local_38);
    handle_stuff(player);
    if (L'\0' < pcVar5->num_spells) {
      local_3c = L'\xffffffff';
      lVar6 = 0;
      lVar7 = 0x20;
      uVar8 = 0;
      do {
        pcVar1 = pcVar5->spells;
        _Var2 = spell_okay_to_study(player,*(wchar_t *)((long)&pcVar1->name + lVar7));
        if ((_Var2) &&
           ((m = uVar8 + 1, (int)uVar8 < 1 || (uVar4 = Rand_div(m), uVar8 = m, uVar4 == 0)))) {
          local_3c = *(wchar_t *)((long)&pcVar1->name + lVar7);
          uVar8 = m;
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x38;
      } while (lVar6 < pcVar5->num_spells);
      if (L'\xffffffff' < local_3c) {
        spell_learn(local_3c);
        player->upkeep->energy_use = (uint)z_info->move_energy;
        return;
      }
    }
    msg("You cannot learn any %ss in that book.",pcVar5->realm->spell_noun);
  }
  return;
}

Assistant:

void do_cmd_study_book(struct command *cmd)
{
	struct object *book_obj;
	const struct class_book *book;
	int spell_index = -1;
	struct class_spell *spell;
	int i, k = 0;

	/* Check the player can study at all atm */
	if (!player_can_study(player, true))
		return;

	if (cmd_get_item(cmd, "item", &book_obj,
			/* Prompt */ "Study which book? ",
			/* Error  */ "You cannot learn any new spells from the books you have.",
			/* Filter */ obj_can_study,
			/* Choice */ USE_INVEN | USE_FLOOR) != CMD_OK)
		return;

	book = player_object_to_book(player, book_obj);
	track_object(player->upkeep, book_obj);
	handle_stuff(player);

	for (i = 0; i < book->num_spells; i++) {
		spell = &book->spells[i];
		if (!spell_okay_to_study(player, spell->sidx))
			continue;
		if ((++k > 1) && (randint0(k) != 0))
			continue;
		spell_index = spell->sidx;
	}

	if (spell_index < 0) {
		msg("You cannot learn any %ss in that book.", book->realm->spell_noun);
	} else {
		spell_learn(spell_index);
		player->upkeep->energy_use = z_info->move_energy;
	}
}